

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_schnorrsig_challenge(secp256k1_scalar *e,uchar *r32,uchar *msg32,uchar *pubkey32)

{
  uchar buf [32];
  uchar auStack_a8 [32];
  secp256k1_sha256 local_88;
  
  local_88.s[0] = 0x9cecba11;
  local_88.s[1] = 0x23925381;
  local_88.s[2] = 0x11679112;
  local_88.s[3] = 0xd1627e0f;
  local_88.s[4] = 0x97c87550;
  local_88.s[5] = 0x3cc765;
  local_88.s[6] = 0x90f61164;
  local_88.s[7] = 0x33e9b66a;
  local_88.bytes = 0x40;
  secp256k1_sha256_write(&local_88,r32,0x20);
  secp256k1_sha256_write(&local_88,pubkey32,0x20);
  secp256k1_sha256_write(&local_88,msg32,0x20);
  secp256k1_sha256_finalize(&local_88,auStack_a8);
  secp256k1_scalar_set_b32(e,auStack_a8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_schnorrsig_challenge(secp256k1_scalar* e, const unsigned char *r32, const unsigned char *msg32, const unsigned char *pubkey32)
{
    unsigned char buf[32];
    secp256k1_sha256 sha;

    /* tagged hash(r.x, pk.x, msg32) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, r32, 32);
    secp256k1_sha256_write(&sha, pubkey32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, buf);
    /* Set scalar e to the challenge hash modulo the curve order as per
     * BIP340. */
    secp256k1_scalar_set_b32(e, buf, NULL);
}